

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategyDriver.cpp
# Opt level: O2

int main(void)

{
  pointer ppPVar1;
  Player *pPVar2;
  char cVar3;
  GameLoop *pGVar4;
  ostream *poVar5;
  iterator __begin2;
  pointer ppPVar6;
  char choice;
  string local_50;
  
  choice = '\0';
  GameLoop::startSingle(true);
  pGVar4 = GameLoop::getInstance();
  GameLoop::distributeArmies(pGVar4);
  std::operator<<((ostream *)&std::cout,
                  "All players have been initialized. Do you want to make all players Humans?(y/n)")
  ;
  std::operator>>((istream *)&std::cin,&choice);
  cVar3 = choice;
  pGVar4 = GameLoop::getInstance();
  ppPVar6 = (pGVar4->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppPVar1 = (pGVar4->allPlayers->super__Vector_base<Player_*,_std::allocator<Player_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (cVar3 == 'y') {
    for (; ppPVar6 != ppPVar1; ppPVar6 = ppPVar6 + 1) {
      pPVar2 = *ppPVar6;
      poVar5 = std::operator<<((ostream *)&std::cout,"Player ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pPVar2->pPlayerId);
      poVar5 = std::operator<<(poVar5," was ");
      PlayerStrategy::getStrategyName_abi_cxx11_(&local_50,pPVar2->strategy);
      poVar5 = std::operator<<(poVar5,(string *)&local_50);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_50);
      Player::setPlayerStrategy(pPVar2,HUMAN_PLAYER);
    }
  }
  else {
    for (; ppPVar6 != ppPVar1; ppPVar6 = ppPVar6 + 1) {
      pPVar2 = *ppPVar6;
      poVar5 = std::operator<<((ostream *)&std::cout,"Player ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pPVar2->pPlayerId);
      poVar5 = std::operator<<(poVar5," is ");
      PlayerStrategy::getStrategyName_abi_cxx11_(&local_50,pPVar2->strategy);
      poVar5 = std::operator<<(poVar5,(string *)&local_50);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  pGVar4 = GameLoop::getInstance();
  GameLoop::loop(pGVar4,-1);
  GameLoop::resetInstance();
  return 0;
}

Assistant:

int main() {

    char choice = '\0';
    GameLoop::startSingle(true);
    GameLoop::getInstance()->distributeArmies();


    std::cout << "All players have been initialized. Do you want to make all players Humans?(y/n)";
    std::cin >> choice;
    if(choice == 'y') {
        for(auto* p : *GameLoop::getInstance()->getAllPlayers()) {
            std::cout << "Player " << p->getPlayerId() << " was " << p->getStrategy()->getStrategyName() << std::endl;
            p->setPlayerStrategy(Strategies::HUMAN_PLAYER);
        }
    } else {
        for(auto* p : *GameLoop::getInstance()->getAllPlayers()) {
            std::cout << "Player " << p->getPlayerId() << " is " << p->getStrategy()->getStrategyName() << std::endl;
        }
    }

    GameLoop::getInstance()->loop();

    GameLoop::resetInstance();
    return 0;
}